

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O0

ostream * operator<<(ostream *out,ProtocolARP *obj)

{
  ProtocolARP *pPVar1;
  ostream *poVar2;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [36];
  int local_1dc;
  string local_1d8 [4];
  int length;
  string s;
  stringstream local_1a8 [8];
  stringstream ss;
  undefined1 local_198 [380];
  int local_1c;
  ProtocolARP *pPStack_18;
  int i;
  ProtocolARP *obj_local;
  ostream *out_local;
  
  pPStack_18 = obj;
  obj_local = (ProtocolARP *)out;
  std::operator<<(out,"ARP Cache (ostream):\n");
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = (ostream *)
             std::ostream::operator<<(local_198,(uint)pPStack_18->Cache[local_1c].IPv4Address[0]);
    std::operator<<(poVar2,".");
    poVar2 = (ostream *)
             std::ostream::operator<<(local_198,(uint)pPStack_18->Cache[local_1c].IPv4Address[1]);
    std::operator<<(poVar2,".");
    poVar2 = (ostream *)
             std::ostream::operator<<(local_198,(uint)pPStack_18->Cache[local_1c].IPv4Address[2]);
    std::operator<<(poVar2,".");
    std::ostream::operator<<(local_198,(uint)pPStack_18->Cache[local_1c].IPv4Address[3]);
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<((ostream *)obj_local,"   ");
    std::operator<<(poVar2,local_1d8);
    for (local_1dc = std::__cxx11::string::size(); pPVar1 = obj_local, local_1dc < 0x13;
        local_1dc = local_1dc + 1) {
      std::operator<<((ostream *)obj_local," ");
    }
    to_hex<unsigned_char>('\0',(ulong)pPStack_18->Cache[local_1c].MACAddress[0]);
    poVar2 = std::operator<<((ostream *)pPVar1,local_200);
    std::operator<<(poVar2,":");
    std::__cxx11::string::~string(local_200);
    pPVar1 = obj_local;
    to_hex<unsigned_char>((uchar)local_220,(ulong)pPStack_18->Cache[local_1c].MACAddress[1]);
    poVar2 = std::operator<<((ostream *)pPVar1,local_220);
    std::operator<<(poVar2,":");
    std::__cxx11::string::~string(local_220);
    pPVar1 = obj_local;
    to_hex<unsigned_char>((uchar)local_240,(ulong)pPStack_18->Cache[local_1c].MACAddress[2]);
    poVar2 = std::operator<<((ostream *)pPVar1,local_240);
    std::operator<<(poVar2,":");
    std::__cxx11::string::~string(local_240);
    pPVar1 = obj_local;
    to_hex<unsigned_char>((uchar)local_260,(ulong)pPStack_18->Cache[local_1c].MACAddress[3]);
    poVar2 = std::operator<<((ostream *)pPVar1,local_260);
    std::operator<<(poVar2,":");
    std::__cxx11::string::~string(local_260);
    pPVar1 = obj_local;
    to_hex<unsigned_char>((uchar)local_280,(ulong)pPStack_18->Cache[local_1c].MACAddress[4]);
    poVar2 = std::operator<<((ostream *)pPVar1,local_280);
    std::operator<<(poVar2,":");
    std::__cxx11::string::~string(local_280);
    pPVar1 = obj_local;
    to_hex<unsigned_char>((uchar)local_2a0,(ulong)pPStack_18->Cache[local_1c].MACAddress[5]);
    std::operator<<((ostream *)pPVar1,local_2a0);
    std::__cxx11::string::~string(local_2a0);
    poVar2 = std::operator<<((ostream *)obj_local,"   age = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)pPStack_18->Cache[local_1c].Age);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return (ostream *)obj_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ProtocolARP& obj)
{
    out << "ARP Cache (ostream):\n";
    for (int i = 0; i < ARPCacheSize; i++)
    {
        std::stringstream ss;
        ss << (int)obj.Cache[i].IPv4Address[0] << ".";
        ss << (int)obj.Cache[i].IPv4Address[1] << ".";
        ss << (int)obj.Cache[i].IPv4Address[2] << ".";
        ss << (int)obj.Cache[i].IPv4Address[3];
        std::string s = ss.str();

        out << "   " << s;
        for (int length = s.size(); length < 19; length++)
        {
            out << " ";
        }
        out << to_hex(obj.Cache[i].MACAddress[0]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[1]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[2]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[3]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[4]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[5]);
        out << "   age = " << (int)obj.Cache[i].Age << "\n";
    }
    return out;
}